

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandAbc9Iso(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  uint local_54;
  uint local_50;
  int fVeryVerbose;
  int fVerbose;
  int fDualOut;
  int fBetterQual;
  int fEstimate;
  int fNewAlgo;
  int c;
  Vec_Ptr_t *vPosEquivs;
  Gia_Man_t *pAig;
  char **argv_local;
  Abc_Frame_t *pAStack_18;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  bVar1 = true;
  fDualOut = 0;
  fVerbose = 0;
  fVeryVerbose = 0;
  local_50 = 0;
  local_54 = 0;
  pAig = (Gia_Man_t *)argv;
  argv_local._4_4_ = argc;
  pAStack_18 = pAbc;
  Extra_UtilGetoptReset();
LAB_002b9b94:
  iVar2 = Extra_UtilGetopt(argv_local._4_4_,&pAig->pName,"neqdvwh");
  if (iVar2 == -1) {
    if (pAStack_18->pGia == (Gia_Man_t *)0x0) {
      Abc_Print(-1,"Abc_CommandAbc9Iso(): There is no AIG.\n");
      pAbc_local._4_4_ = 1;
    }
    else {
      iVar2 = Gia_ManPoNum(pAStack_18->pGia);
      if (iVar2 == 1) {
        Abc_Print(-1,
                  "Abc_CommandAbc9Iso(): The AIG has only one PO. Isomorphism detection is not performed.\n"
                 );
        pAbc_local._4_4_ = 1;
      }
      else {
        if (bVar1) {
          vPosEquivs = (Vec_Ptr_t *)
                       Gia_ManIsoReduce2(pAStack_18->pGia,(Vec_Ptr_t **)&fNewAlgo,(Vec_Ptr_t **)0x0,
                                         fDualOut,fVerbose,fVeryVerbose,local_50,local_54);
        }
        else {
          vPosEquivs = (Vec_Ptr_t *)
                       Gia_ManIsoReduce(pAStack_18->pGia,(Vec_Ptr_t **)&fNewAlgo,(Vec_Ptr_t **)0x0,
                                        fDualOut,fVeryVerbose,local_50,local_54);
        }
        if (vPosEquivs == (Vec_Ptr_t *)0x0) {
          Abc_Print(-1,"Abc_CommandAbc9Iso(): Transformation has failed.\n");
          pAbc_local._4_4_ = 1;
        }
        else {
          Abc_FrameReplacePoEquivs(pAStack_18,(Vec_Ptr_t **)&fNewAlgo);
          Abc_FrameUpdateGia(pAStack_18,(Gia_Man_t *)vPosEquivs);
          pAbc_local._4_4_ = 0;
        }
      }
    }
    return pAbc_local._4_4_;
  }
  switch(iVar2) {
  case 100:
    fVeryVerbose = fVeryVerbose ^ 1;
    goto LAB_002b9b94;
  case 0x65:
    fDualOut = fDualOut ^ 1;
    goto LAB_002b9b94;
  default:
    break;
  case 0x68:
    break;
  case 0x6e:
    bVar1 = (bool)(bVar1 ^ 1);
    goto LAB_002b9b94;
  case 0x71:
    fVerbose = fVerbose ^ 1;
    goto LAB_002b9b94;
  case 0x76:
    local_50 = local_50 ^ 1;
    goto LAB_002b9b94;
  case 0x77:
    goto switchD_002b9bd2_caseD_77;
  }
  Abc_Print(-2,"usage: &iso [-neqdvwh]\n");
  Abc_Print(-2,"\t         removes POs with isomorphic sequential COI\n");
  pcVar3 = "no";
  if (bVar1) {
    pcVar3 = "yes";
  }
  Abc_Print(-2,"\t-n     : toggle using new fast algorithm [default = %s]\n",pcVar3);
  pcVar3 = "no";
  if (fDualOut != 0) {
    pcVar3 = "yes";
  }
  Abc_Print(-2,"\t-e     : toggle computing lower bound on equivalence classes [default = %s]\n",
            pcVar3);
  pcVar3 = "no";
  if (fVerbose != 0) {
    pcVar3 = "yes";
  }
  Abc_Print(-2,"\t-q     : toggle improving quality at the expense of runtime [default = %s]\n",
            pcVar3);
  pcVar3 = "no";
  if (fVeryVerbose != 0) {
    pcVar3 = "yes";
  }
  Abc_Print(-2,"\t-d     : toggle treating the current AIG as a dual-output miter [default = %s]\n",
            pcVar3);
  pcVar3 = "no";
  if (local_50 != 0) {
    pcVar3 = "yes";
  }
  Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar3);
  pcVar3 = "no";
  if (local_54 != 0) {
    pcVar3 = "yes";
  }
  Abc_Print(-2,"\t-w     : toggle printing very verbose information [default = %s]\n",pcVar3);
  Abc_Print(-2,"\t-h     : print the command usage\n");
  return 1;
switchD_002b9bd2_caseD_77:
  local_54 = local_54 ^ 1;
  goto LAB_002b9b94;
}

Assistant:

int Abc_CommandAbc9Iso( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Gia_Man_t * pAig;
    Vec_Ptr_t * vPosEquivs;
//    Vec_Ptr_t * vPiPerms;
    int c, fNewAlgo = 1, fEstimate = 0, fBetterQual = 0, fDualOut = 0, fVerbose = 0, fVeryVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "neqdvwh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'n':
            fNewAlgo ^= 1;
            break;
        case 'e':
            fEstimate ^= 1;
            break;
        case 'q':
            fBetterQual ^= 1;
            break;
        case 'd':
            fDualOut ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'w':
            fVeryVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9Iso(): There is no AIG.\n" );
        return 1;
    }
    if ( Gia_ManPoNum(pAbc->pGia) == 1 )
    {
        Abc_Print( -1, "Abc_CommandAbc9Iso(): The AIG has only one PO. Isomorphism detection is not performed.\n" );
        return 1;
    }
    if ( fNewAlgo )
        pAig = Gia_ManIsoReduce2( pAbc->pGia, &vPosEquivs, NULL, fEstimate, fBetterQual, fDualOut, fVerbose, fVeryVerbose );
    else
        pAig = Gia_ManIsoReduce( pAbc->pGia, &vPosEquivs, NULL, fEstimate, fDualOut, fVerbose, fVeryVerbose );
//    pAig = Gia_ManIsoReduce( pAbc->pGia, &vPosEquivs, &vPiPerms, 0, fDualOut, fVerbose, fVeryVerbose );
//    Vec_VecFree( (Vec_Vec_t *)vPiPerms );
    if ( pAig == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9Iso(): Transformation has failed.\n" );
        return 1;
    }
    // update the internal storage of PO equivalences
    Abc_FrameReplacePoEquivs( pAbc, &vPosEquivs );
    // update the AIG
    Abc_FrameUpdateGia( pAbc, pAig );
    return 0;

usage:
    Abc_Print( -2, "usage: &iso [-neqdvwh]\n" );
    Abc_Print( -2, "\t         removes POs with isomorphic sequential COI\n" );
    Abc_Print( -2, "\t-n     : toggle using new fast algorithm [default = %s]\n", fNewAlgo? "yes": "no" );
    Abc_Print( -2, "\t-e     : toggle computing lower bound on equivalence classes [default = %s]\n", fEstimate? "yes": "no" );
    Abc_Print( -2, "\t-q     : toggle improving quality at the expense of runtime [default = %s]\n", fBetterQual? "yes": "no" );
    Abc_Print( -2, "\t-d     : toggle treating the current AIG as a dual-output miter [default = %s]\n", fDualOut? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-w     : toggle printing very verbose information [default = %s]\n", fVeryVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}